

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O0

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunCheckOutput(AV1CornerMatchTest *this)

{
  code *pcVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
  *p_Var5;
  pointer puVar6;
  pointer frame2;
  Message *message;
  long in_RDI;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  double simd_corr;
  double c_corr;
  bool simd_valid2;
  bool simd_valid1;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  bool c_valid2;
  bool c_valid1;
  double c_one_over_stddev2;
  double c_mean2;
  double c_one_over_stddev1;
  double c_mean1;
  int y2;
  int x2;
  int y1;
  int x1;
  int i;
  int mode;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input1;
  int num_iters;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int iVar7;
  undefined4 in_stack_fffffffffffffcc4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  char *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  uint8_t *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  Message *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int iVar8;
  undefined4 in_stack_fffffffffffffd44;
  int iVar9;
  AssertionResult local_1d8 [2];
  AssertionResult local_1b8 [2];
  AssertionResult local_198 [2];
  AssertionResult local_178 [2];
  AssertionResult local_158 [2];
  AssertionResult local_138 [2];
  AssertionResult local_118;
  undefined8 local_108;
  double local_100;
  byte local_f2;
  byte local_f1;
  undefined1 local_f0 [8];
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  undefined1 local_d8 [14];
  undefined1 local_ca;
  undefined1 local_c9;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  __tuple_element_t<0UL,_tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
  local_94;
  undefined8 local_80;
  AssertionResult local_78;
  uint local_64;
  undefined8 local_40;
  AssertionResult local_38 [2];
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x80;
  local_10 = 0x80;
  local_14 = 1000;
  operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (uchar *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (uchar *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  local_40 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            (in_stack_fffffffffffffcd8,
             (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             in_stack_fffffffffffffcc8,
             (void **)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar4 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!bVar4) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    testing::AssertionResult::failure_message((AssertionResult *)0x31440d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    testing::Message::~Message((Message *)0x314470);
  }
  local_64 = (uint)!bVar4;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3144de);
  if (local_64 == 0) {
    local_80 = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              (in_stack_fffffffffffffcd8,
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcc8,
               (void **)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar4) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      testing::AssertionResult::failure_message((AssertionResult *)0x314597);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      testing::Message::~Message((Message *)0x3145fa);
    }
    local_64 = (uint)!bVar4;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x314668);
    if (local_64 == 0) {
      testing::
      WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
      ::GetParam();
      p_Var5 = std::
               get<0ul,int,bool(*)(unsigned_char_const*,int,int,int,double*,double*),double(*)(unsigned_char_const*,int,int,int,double,double,unsigned_char_const*,int,int,int,double,double)>
                         ((tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                           *)0x314695);
      local_94 = *p_Var5;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      GenerateInput((AV1CornerMatchTest *)
                    CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                    in_stack_fffffffffffffce8,
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),(int)in_stack_fffffffffffffcd8,
                    in_stack_fffffffffffffcd4);
      for (local_98 = 0; local_98 < 1000; local_98 = local_98 + 1) {
        local_9c = libaom_test::ACMRandom::PseudoUniform
                             ((ACMRandom *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              in_stack_fffffffffffffcbc);
        local_9c = local_9c + 7;
        local_a0 = libaom_test::ACMRandom::PseudoUniform
                             ((ACMRandom *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              in_stack_fffffffffffffcbc);
        local_a0 = local_a0 + 7;
        local_a4 = libaom_test::ACMRandom::PseudoUniform
                             ((ACMRandom *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              in_stack_fffffffffffffcbc);
        local_a4 = local_a4 + 7;
        local_a8 = libaom_test::ACMRandom::PseudoUniform
                             ((ACMRandom *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              in_stack_fffffffffffffcbc);
        local_a8 = local_a8 + 7;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        local_c9 = aom_compute_mean_stddev_c
                             (in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                              in_stack_fffffffffffffce0,
                              (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                              (double *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                              (double *)in_stack_fffffffffffffcc8);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        local_ca = aom_compute_mean_stddev_c
                             (in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                              in_stack_fffffffffffffce0,
                              (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                              (double *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                              (double *)in_stack_fffffffffffffcc8);
        pcVar1 = *(code **)(in_RDI + 0x18);
        puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        local_f1 = (*pcVar1)(puVar6,0x80,local_9c,local_a0,local_d8,local_e0);
        local_f1 = local_f1 & 1;
        pcVar1 = *(code **)(in_RDI + 0x18);
        puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        local_f2 = (*pcVar1)(puVar6,0x80,local_a4,local_a8,local_e8,local_f0);
        local_f2 = local_f2 & 1;
        puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        iVar9 = local_9c;
        iVar8 = local_a0;
        dVar3 = local_b0;
        dVar2 = local_b8;
        frame2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        iVar7 = local_a8;
        local_100 = aom_compute_correlation_c
                              (puVar6,0x80,iVar9,iVar8,dVar3,dVar2,frame2,0x80,local_a4,local_a8,
                               local_c0,local_c8);
        pcVar1 = *(code **)(in_RDI + 0x20);
        message = (Message *)
                  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             CONCAT44(in_stack_fffffffffffffcc4,iVar7));
        dVar3 = local_b0;
        dVar2 = local_b8;
        iVar8 = local_9c;
        iVar9 = local_a0;
        puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffcc4,iVar7));
        in_stack_fffffffffffffcc0 = local_a8;
        local_108 = (*pcVar1)(dVar3,dVar2,local_c0,local_c8,message,0x80,iVar8,iVar9,puVar6,0x80,
                              local_a4);
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (bool *)in_stack_fffffffffffffcc8,
                   (bool *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_118);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          testing::AssertionResult::failure_message((AssertionResult *)0x314bcd);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x314c2a);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x314c95);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (bool *)in_stack_fffffffffffffcc8,
                   (bool *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_138);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          testing::AssertionResult::failure_message((AssertionResult *)0x314d3c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x314d99);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x314e04);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (double *)in_stack_fffffffffffffcc8,
                   (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_158);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          testing::AssertionResult::failure_message((AssertionResult *)0x314eab);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x314f08);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x314f73);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (double *)in_stack_fffffffffffffcc8,
                   (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_178);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          testing::AssertionResult::failure_message((AssertionResult *)0x31501a);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x315077);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3150e2);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (double *)in_stack_fffffffffffffcc8,
                   (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_198);
        in_stack_fffffffffffffcf7 = bVar4;
        if (!bVar4) {
          testing::Message::Message((Message *)CONCAT17(bVar4,in_stack_fffffffffffffcf0));
          in_stack_fffffffffffffce8 =
               (uint8_t *)testing::AssertionResult::failure_message((AssertionResult *)0x315189);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x3151e6);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x315251);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (double *)in_stack_fffffffffffffcc8,
                   (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
        in_stack_fffffffffffffce4 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffce4);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          in_stack_fffffffffffffcd8 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3152f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x315355);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3153c0);
        if (local_64 != 0) goto LAB_0031556e;
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  (in_stack_fffffffffffffcd8,
                   (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (double *)in_stack_fffffffffffffcc8,
                   (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar4 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
        in_stack_fffffffffffffcd4 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffcd4);
        if (!bVar4) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          in_stack_fffffffffffffcc8 =
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x315467);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                     (Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          testing::internal::AssertHelper::operator=((AssertHelper *)CONCAT44(iVar9,iVar8),message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          testing::Message::~Message((Message *)0x3154c4);
        }
        local_64 = (uint)!bVar4;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x31552f);
        if (local_64 != 0) goto LAB_0031556e;
      }
      local_64 = 0;
    }
  }
LAB_0031556e:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  return;
}

Assistant:

void AV1CornerMatchTest::RunCheckOutput() {
  const int w = 128, h = 128;
  const int num_iters = 1000;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  for (int i = 0; i < num_iters; ++i) {
    int x1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);
    int x2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);

    double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
    bool c_valid1 = aom_compute_mean_stddev_c(input1.get(), w, x1, y1, &c_mean1,
                                              &c_one_over_stddev1);
    bool c_valid2 = aom_compute_mean_stddev_c(input2.get(), w, x2, y2, &c_mean2,
                                              &c_one_over_stddev2);

    double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
    bool simd_valid1 = target_compute_mean_stddev_func(
        input1.get(), w, x1, y1, &simd_mean1, &simd_one_over_stddev1);
    bool simd_valid2 = target_compute_mean_stddev_func(
        input2.get(), w, x2, y2, &simd_mean2, &simd_one_over_stddev2);

    // Run the correlation calculation even if one of the "valid" flags is
    // false, i.e. if one of the patches doesn't have enough variance. This is
    // safe because any potential division by 0 is caught in
    // aom_compute_mean_stddev(), and one_over_stddev is set to 0 instead.
    // This causes aom_compute_correlation() to return 0, without causing a
    // division by 0.
    const double c_corr = aom_compute_correlation_c(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);
    const double simd_corr = target_compute_corr_func(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);

    ASSERT_EQ(simd_valid1, c_valid1);
    ASSERT_EQ(simd_valid2, c_valid2);
    ASSERT_EQ(simd_mean1, c_mean1);
    ASSERT_EQ(simd_one_over_stddev1, c_one_over_stddev1);
    ASSERT_EQ(simd_mean2, c_mean2);
    ASSERT_EQ(simd_one_over_stddev2, c_one_over_stddev2);
    ASSERT_EQ(simd_corr, c_corr);
  }
}